

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Query.cpp
# Opt level: O3

void __thiscall
Query::prefetch(Query *this,int from_index,int howmany,bool only_last,PrefetchFunc *prefetcher)

{
  pointer pQVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  PrimitiveQuery local_38;
  
  if (0 < howmany) {
    uVar3 = (ulong)(uint)howmany;
    uVar4 = (ulong)from_index;
    lVar5 = uVar4 * 0x48;
    do {
      pQVar1 = (this->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar2 = ((long)(this->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)pQVar1 >> 3) * -0x71c71c71c71c71c7;
      if (uVar2 < uVar4 || uVar2 - uVar4 == 0) {
        return;
      }
      if ((uVar3 == 1 || !only_last) && *(int *)((long)&pQVar1->type + lVar5) == 1) {
        local_38 = *(PrimitiveQuery *)((long)&(pQVar1->ngram).itype + lVar5);
        if ((prefetcher->super__Function_base)._M_manager == (_Manager_type)0x0) {
          std::__throw_bad_function_call();
        }
        (*prefetcher->_M_invoker)((_Any_data *)prefetcher,&local_38);
      }
      uVar4 = uVar4 + 1;
      lVar5 = lVar5 + 0x48;
      uVar3 = uVar3 - 1;
    } while (uVar3 != 0);
  }
  return;
}

Assistant:

void Query::prefetch(int from_index, int howmany, bool only_last,
                     const PrefetchFunc &prefetcher) const {
    for (int i = 0; i < howmany; i++) {
        int ndx = i + from_index;
        if (ndx >= queries.size()) {
            break;
        }
        if (queries[ndx].type == QueryType::PRIMITIVE) {
            if (only_last && (i + 1 != howmany)) {
                continue;
            }
            prefetcher(queries[ndx].ngram);
        }
    }
}